

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O3

void __thiscall nv::ColorBlock::boundsRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  Color32 CVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bVar20;
  byte bVar24;
  byte bVar26;
  byte bVar28;
  byte bVar30;
  byte bVar32;
  byte bVar34;
  byte bVar36;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar38;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar54;
  byte bVar56;
  byte bVar58;
  byte bVar60;
  byte bVar62;
  byte bVar64;
  byte bVar66;
  byte bVar68;
  byte bVar70;
  byte bVar72;
  byte bVar74;
  undefined1 auVar76 [16];
  byte bVar21;
  byte bVar25;
  byte bVar27;
  byte bVar29;
  byte bVar31;
  byte bVar33;
  byte bVar35;
  byte bVar37;
  byte bVar53;
  byte bVar55;
  byte bVar57;
  byte bVar59;
  byte bVar61;
  byte bVar63;
  byte bVar65;
  byte bVar67;
  byte bVar69;
  byte bVar71;
  byte bVar73;
  byte bVar75;
  
  auVar39 = psllw(ZEXT416(this->m_color[1].field_0.u),8);
  auVar12._4_4_ = this->m_color[4].field_0.u;
  auVar12._0_4_ = this->m_color[4].field_0.u;
  auVar12._8_8_ = 0;
  auVar13._0_8_ = (ulong)this->m_color[5].field_0.u << 0x28;
  auVar13._8_8_ = 0;
  auVar14._0_8_ = (ulong)this->m_color[6].field_0.u << 0x30;
  auVar14._8_8_ = 0;
  auVar15._0_8_ = (ulong)this->m_color[7].field_0.u << 0x38;
  auVar15._8_8_ = 0;
  auVar16._4_4_ = 0;
  auVar16._0_4_ = this->m_color[8].field_0.u;
  auVar16._8_4_ = this->m_color[8].field_0.u;
  auVar16._12_4_ = 0;
  CVar1.field_0 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[0xc].field_0.u;
  auVar17._4_4_ = CVar1.field_0;
  auVar17._0_4_ = CVar1.field_0;
  auVar17._8_4_ = CVar1.field_0;
  auVar17._12_4_ = CVar1.field_0;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (ulong)this->m_color[0xd].field_0.u << 0x28;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = (ulong)this->m_color[0xe].field_0.u << 0x30;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = (ulong)this->m_color[0xf].field_0.u << 0x38;
  auVar76 = auVar76 << 0x40 |
            (auVar40 << 0x40 |
            (~_DAT_001f8540 & auVar18 << 0x40 |
            (~_DAT_001f8530 & auVar17 |
            (~_DAT_001f8520 & ZEXT416(this->m_color[0xb].field_0.u) << 0x58 |
            (~_DAT_001f8510 & ZEXT416(this->m_color[10].field_0.u) << 0x50 |
            (~_DAT_001f8500 & ZEXT416(this->m_color[9].field_0.u) << 0x48 |
            (~_DAT_001f84f0 & auVar16 |
            (~_DAT_001f84e0 & auVar15 |
            (~_DAT_001f84d0 & auVar14 |
            (~_DAT_001f84c0 & auVar13 |
            (~_DAT_001f84b0 & auVar12 |
            (~_DAT_001f84a0 & ZEXT416(this->m_color[3].field_0.u << 0x18) |
            (~_DAT_001f8490 & ZEXT416(this->m_color[2].field_0.u << 0x10) |
            (~_DAT_001f8480 & auVar39 | *(undefined1 (*) [16])this->m_color & _DAT_001f8480) &
            _DAT_001f8490) & _DAT_001f84a0) & _DAT_001f84b0) & _DAT_001f84c0) & _DAT_001f84d0) &
            _DAT_001f84e0) & _DAT_001f84f0) & _DAT_001f8500) & _DAT_001f8510) & _DAT_001f8520) &
            _DAT_001f8530) & _DAT_001f8540) & _DAT_001f8550) & _DAT_001f8560;
  auVar18 = psllw(ZEXT116(this->m_color[1].field_0.field_0.g),8);
  bVar38 = this->m_color[4].field_0.field_0.g;
  bVar20 = this->m_color[8].field_0.field_0.g;
  auVar39._1_7_ = 0;
  auVar39[0] = bVar20;
  auVar39[8] = bVar20;
  auVar39._9_7_ = 0;
  bVar20 = this->m_color[0xc].field_0.field_0.g;
  auVar19._1_3_ = 0;
  auVar19[0] = bVar20;
  auVar19[4] = bVar20;
  auVar19._5_3_ = 0;
  auVar19[8] = bVar20;
  auVar19._9_3_ = 0;
  auVar19[0xc] = bVar20;
  auVar19._13_3_ = 0;
  auVar18 = ZEXT116(this->m_color[0xf].field_0.field_0.g) << 0x78 |
            (ZEXT116(this->m_color[0xe].field_0.field_0.g) << 0x70 |
            (~_DAT_001f8540 & ZEXT116(this->m_color[0xd].field_0.field_0.g) << 0x68 |
            (~_DAT_001f8530 & auVar19 |
            (~_DAT_001f8520 & ZEXT116(this->m_color[0xb].field_0.field_0.g) << 0x58 |
            (~_DAT_001f8510 & ZEXT116(this->m_color[10].field_0.field_0.g) << 0x50 |
            (~_DAT_001f8500 & ZEXT116(this->m_color[9].field_0.field_0.g) << 0x48 |
            (~_DAT_001f84f0 & auVar39 |
            (~_DAT_001f84e0 & ZEXT116(this->m_color[7].field_0.field_0.g) << 0x38 |
            (~_DAT_001f84d0 & ZEXT116(this->m_color[6].field_0.field_0.g) << 0x30 |
            (~_DAT_001f84c0 & ZEXT116(this->m_color[5].field_0.field_0.g) << 0x28 |
            (~_DAT_001f84b0 & ZEXT516(CONCAT14(bVar38,(uint)bVar38)) |
            (~_DAT_001f84a0 & ZEXT116(this->m_color[3].field_0.field_0.g) << 0x18 |
            (~_DAT_001f8490 & ZEXT116(this->m_color[2].field_0.field_0.g) << 0x10 |
            (~_DAT_001f8480 & auVar18 |
            *(undefined1 (*) [16])((long)&this->m_color[0].field_0 + 1) & _DAT_001f8480) &
            _DAT_001f8490) & _DAT_001f84a0) & _DAT_001f84b0) & _DAT_001f84c0) & _DAT_001f84d0) &
            _DAT_001f84e0) & _DAT_001f84f0) & _DAT_001f8500) & _DAT_001f8510) & _DAT_001f8520) &
            _DAT_001f8530) & _DAT_001f8540) & _DAT_001f8550) & _DAT_001f8560;
  auVar40 = psllw(ZEXT116(this->m_color[1].field_0.field_0.r),8);
  bVar38 = this->m_color[4].field_0.field_0.r;
  bVar20 = this->m_color[8].field_0.field_0.r;
  auVar22._1_7_ = 0;
  auVar22[0] = bVar20;
  auVar22[8] = bVar20;
  auVar22._9_7_ = 0;
  bVar20 = this->m_color[0xc].field_0.field_0.r;
  auVar23._1_3_ = 0;
  auVar23[0] = bVar20;
  auVar23[4] = bVar20;
  auVar23._5_3_ = 0;
  auVar23[8] = bVar20;
  auVar23._9_3_ = 0;
  auVar23[0xc] = bVar20;
  auVar23._13_3_ = 0;
  auVar40 = ZEXT116(this->m_color[0xf].field_0.field_0.r) << 0x78 |
            (ZEXT116(this->m_color[0xe].field_0.field_0.r) << 0x70 |
            (~_DAT_001f8540 & ZEXT116(this->m_color[0xd].field_0.field_0.r) << 0x68 |
            (~_DAT_001f8530 & auVar23 |
            (~_DAT_001f8520 & ZEXT116(this->m_color[0xb].field_0.field_0.r) << 0x58 |
            (~_DAT_001f8510 & ZEXT116(this->m_color[10].field_0.field_0.r) << 0x50 |
            (~_DAT_001f8500 & ZEXT116(this->m_color[9].field_0.field_0.r) << 0x48 |
            (~_DAT_001f84f0 & auVar22 |
            (~_DAT_001f84e0 & ZEXT116(this->m_color[7].field_0.field_0.r) << 0x38 |
            (~_DAT_001f84d0 & ZEXT116(this->m_color[6].field_0.field_0.r) << 0x30 |
            (~_DAT_001f84c0 & ZEXT116(this->m_color[5].field_0.field_0.r) << 0x28 |
            (~_DAT_001f84b0 & ZEXT516(CONCAT14(bVar38,(uint)bVar38)) |
            (~_DAT_001f84a0 & ZEXT116(this->m_color[3].field_0.field_0.r) << 0x18 |
            (~_DAT_001f8490 & ZEXT116(this->m_color[2].field_0.field_0.r) << 0x10 |
            (~_DAT_001f8480 & auVar40 |
            *(undefined1 (*) [16])((long)&this->m_color[0].field_0 + 2) & _DAT_001f8480) &
            _DAT_001f8490) & _DAT_001f84a0) & _DAT_001f84b0) & _DAT_001f84c0) & _DAT_001f84d0) &
            _DAT_001f84e0) & _DAT_001f84f0) & _DAT_001f8500) & _DAT_001f8510) & _DAT_001f8520) &
            _DAT_001f8530) & _DAT_001f8540) & _DAT_001f8550) & _DAT_001f8560;
  bVar38 = auVar40[8];
  bVar21 = auVar40[0];
  bVar20 = (bVar38 < bVar21) * bVar38 | (bVar38 >= bVar21) * bVar21;
  bVar41 = auVar40[9];
  bVar25 = auVar40[1];
  bVar24 = (bVar41 < bVar25) * bVar41 | (bVar41 >= bVar25) * bVar25;
  bVar42 = auVar40[10];
  bVar27 = auVar40[2];
  bVar26 = (bVar42 < bVar27) * bVar42 | (bVar42 >= bVar27) * bVar27;
  bVar43 = auVar40[0xb];
  bVar29 = auVar40[3];
  bVar28 = (bVar43 < bVar29) * bVar43 | (bVar43 >= bVar29) * bVar29;
  bVar44 = auVar40[0xc];
  bVar31 = auVar40[4];
  bVar30 = (bVar44 < bVar31) * bVar44 | (bVar44 >= bVar31) * bVar31;
  bVar45 = auVar40[0xd];
  bVar33 = auVar40[5];
  bVar32 = (bVar45 < bVar33) * bVar45 | (bVar45 >= bVar33) * bVar33;
  bVar46 = auVar40[0xe];
  bVar35 = auVar40[6];
  bVar34 = (bVar46 < bVar35) * bVar46 | (bVar46 >= bVar35) * bVar35;
  bVar47 = auVar40[0xf];
  bVar37 = auVar40[7];
  bVar36 = (bVar47 < bVar37) * bVar47 | (bVar47 >= bVar37) * bVar37;
  bVar20 = (bVar20 < bVar30) * bVar20 | (bVar20 >= bVar30) * bVar30;
  bVar24 = (bVar24 < bVar32) * bVar24 | (bVar24 >= bVar32) * bVar32;
  bVar26 = (bVar26 < bVar34) * bVar26 | (bVar26 >= bVar34) * bVar34;
  bVar28 = (bVar28 < bVar36) * bVar28 | (bVar28 >= bVar36) * bVar36;
  bVar20 = (bVar20 < bVar26) * bVar20 | (bVar20 >= bVar26) * bVar26;
  bVar24 = (bVar24 < bVar28) * bVar24 | (bVar24 >= bVar28) * bVar28;
  uVar10 = (uint)(byte)((bVar20 < bVar24) * bVar20 | (bVar20 >= bVar24) * bVar24);
  bVar20 = auVar18[8];
  bVar48 = auVar18[0];
  bVar24 = (bVar20 < bVar48) * bVar20 | (bVar20 >= bVar48) * bVar48;
  bVar26 = auVar18[9];
  bVar49 = auVar18[1];
  bVar28 = (bVar26 < bVar49) * bVar26 | (bVar26 >= bVar49) * bVar49;
  bVar30 = auVar18[10];
  bVar50 = auVar18[2];
  bVar32 = (bVar30 < bVar50) * bVar30 | (bVar30 >= bVar50) * bVar50;
  bVar34 = auVar18[0xb];
  bVar51 = auVar18[3];
  bVar36 = (bVar34 < bVar51) * bVar34 | (bVar34 >= bVar51) * bVar51;
  bVar2 = auVar18[0xc];
  bVar53 = auVar18[4];
  bVar52 = (bVar2 < bVar53) * bVar2 | (bVar2 >= bVar53) * bVar53;
  bVar3 = auVar18[0xd];
  bVar55 = auVar18[5];
  bVar54 = (bVar3 < bVar55) * bVar3 | (bVar3 >= bVar55) * bVar55;
  bVar4 = auVar18[0xe];
  bVar57 = auVar18[6];
  bVar56 = (bVar4 < bVar57) * bVar4 | (bVar4 >= bVar57) * bVar57;
  bVar5 = auVar18[0xf];
  bVar59 = auVar18[7];
  bVar58 = (bVar5 < bVar59) * bVar5 | (bVar5 >= bVar59) * bVar59;
  bVar24 = (bVar24 < bVar52) * bVar24 | (bVar24 >= bVar52) * bVar52;
  bVar28 = (bVar28 < bVar54) * bVar28 | (bVar28 >= bVar54) * bVar54;
  bVar32 = (bVar32 < bVar56) * bVar32 | (bVar32 >= bVar56) * bVar56;
  bVar36 = (bVar36 < bVar58) * bVar36 | (bVar36 >= bVar58) * bVar58;
  bVar24 = (bVar24 < bVar32) * bVar24 | (bVar24 >= bVar32) * bVar32;
  bVar28 = (bVar28 < bVar36) * bVar28 | (bVar28 >= bVar36) * bVar36;
  uVar6 = (uint)(byte)((bVar24 < bVar28) * bVar24 | (bVar24 >= bVar28) * bVar28);
  bVar24 = auVar76[8];
  bVar61 = auVar76[0];
  bVar60 = (bVar24 < bVar61) * bVar24 | (bVar24 >= bVar61) * bVar61;
  bVar28 = auVar76[9];
  bVar63 = auVar76[1];
  bVar62 = (bVar28 < bVar63) * bVar28 | (bVar28 >= bVar63) * bVar63;
  bVar32 = auVar76[10];
  bVar65 = auVar76[2];
  bVar64 = (bVar32 < bVar65) * bVar32 | (bVar32 >= bVar65) * bVar65;
  bVar36 = auVar76[0xb];
  bVar67 = auVar76[3];
  bVar66 = (bVar36 < bVar67) * bVar36 | (bVar36 >= bVar67) * bVar67;
  bVar52 = auVar76[0xc];
  bVar69 = auVar76[4];
  bVar68 = (bVar52 < bVar69) * bVar52 | (bVar52 >= bVar69) * bVar69;
  bVar54 = auVar76[0xd];
  bVar71 = auVar76[5];
  bVar70 = (bVar54 < bVar71) * bVar54 | (bVar54 >= bVar71) * bVar71;
  bVar56 = auVar76[0xe];
  bVar73 = auVar76[6];
  bVar72 = (bVar56 < bVar73) * bVar56 | (bVar56 >= bVar73) * bVar73;
  bVar58 = auVar76[0xf];
  bVar75 = auVar76[7];
  bVar74 = (bVar58 < bVar75) * bVar58 | (bVar58 >= bVar75) * bVar75;
  bVar60 = (bVar60 < bVar68) * bVar60 | (bVar60 >= bVar68) * bVar68;
  bVar62 = (bVar62 < bVar70) * bVar62 | (bVar62 >= bVar70) * bVar70;
  bVar64 = (bVar64 < bVar72) * bVar64 | (bVar64 >= bVar72) * bVar72;
  bVar66 = (bVar66 < bVar74) * bVar66 | (bVar66 >= bVar74) * bVar74;
  bVar60 = (bVar60 < bVar64) * bVar60 | (bVar60 >= bVar64) * bVar64;
  bVar62 = (bVar62 < bVar66) * bVar62 | (bVar62 >= bVar66) * bVar66;
  uVar7 = (uint)(byte)((bVar60 < bVar62) * bVar60 | (bVar60 >= bVar62) * bVar62);
  bVar38 = (bVar21 < bVar38) * bVar38 | (bVar21 >= bVar38) * bVar21;
  bVar41 = (bVar25 < bVar41) * bVar41 | (bVar25 >= bVar41) * bVar25;
  bVar42 = (bVar27 < bVar42) * bVar42 | (bVar27 >= bVar42) * bVar27;
  bVar43 = (bVar29 < bVar43) * bVar43 | (bVar29 >= bVar43) * bVar29;
  bVar44 = (bVar31 < bVar44) * bVar44 | (bVar31 >= bVar44) * bVar31;
  bVar45 = (bVar33 < bVar45) * bVar45 | (bVar33 >= bVar45) * bVar33;
  bVar46 = (bVar35 < bVar46) * bVar46 | (bVar35 >= bVar46) * bVar35;
  bVar47 = (bVar37 < bVar47) * bVar47 | (bVar37 >= bVar47) * bVar37;
  bVar38 = (bVar44 < bVar38) * bVar38 | (bVar44 >= bVar38) * bVar44;
  bVar41 = (bVar45 < bVar41) * bVar41 | (bVar45 >= bVar41) * bVar45;
  bVar42 = (bVar46 < bVar42) * bVar42 | (bVar46 >= bVar42) * bVar46;
  bVar43 = (bVar47 < bVar43) * bVar43 | (bVar47 >= bVar43) * bVar47;
  bVar38 = (bVar42 < bVar38) * bVar38 | (bVar42 >= bVar38) * bVar42;
  bVar41 = (bVar43 < bVar41) * bVar41 | (bVar43 >= bVar41) * bVar43;
  bVar43 = (bVar41 < bVar38) * bVar38 | (bVar41 >= bVar38) * bVar41;
  bVar38 = (bVar61 < bVar24) * bVar24 | (bVar61 >= bVar24) * bVar61;
  bVar24 = (bVar63 < bVar28) * bVar28 | (bVar63 >= bVar28) * bVar63;
  bVar41 = (bVar65 < bVar32) * bVar32 | (bVar65 >= bVar32) * bVar65;
  bVar28 = (bVar67 < bVar36) * bVar36 | (bVar67 >= bVar36) * bVar67;
  bVar42 = (bVar69 < bVar52) * bVar52 | (bVar69 >= bVar52) * bVar69;
  bVar32 = (bVar71 < bVar54) * bVar54 | (bVar71 >= bVar54) * bVar71;
  bVar36 = (bVar73 < bVar56) * bVar56 | (bVar73 >= bVar56) * bVar73;
  bVar44 = (bVar75 < bVar58) * bVar58 | (bVar75 >= bVar58) * bVar75;
  bVar38 = (bVar42 < bVar38) * bVar38 | (bVar42 >= bVar38) * bVar42;
  bVar24 = (bVar32 < bVar24) * bVar24 | (bVar32 >= bVar24) * bVar32;
  bVar41 = (bVar36 < bVar41) * bVar41 | (bVar36 >= bVar41) * bVar36;
  bVar28 = (bVar44 < bVar28) * bVar28 | (bVar44 >= bVar28) * bVar44;
  bVar38 = (bVar41 < bVar38) * bVar38 | (bVar41 >= bVar38) * bVar41;
  bVar24 = (bVar28 < bVar24) * bVar24 | (bVar28 >= bVar24) * bVar28;
  bVar32 = (bVar24 < bVar38) * bVar38 | (bVar24 >= bVar38) * bVar24;
  bVar38 = (bVar48 < bVar20) * bVar20 | (bVar48 >= bVar20) * bVar48;
  bVar20 = (bVar49 < bVar26) * bVar26 | (bVar49 >= bVar26) * bVar49;
  bVar24 = (bVar50 < bVar30) * bVar30 | (bVar50 >= bVar30) * bVar50;
  bVar41 = (bVar51 < bVar34) * bVar34 | (bVar51 >= bVar34) * bVar51;
  bVar26 = (bVar53 < bVar2) * bVar2 | (bVar53 >= bVar2) * bVar53;
  bVar28 = (bVar55 < bVar3) * bVar3 | (bVar55 >= bVar3) * bVar55;
  bVar42 = (bVar57 < bVar4) * bVar4 | (bVar57 >= bVar4) * bVar57;
  bVar30 = (bVar59 < bVar5) * bVar5 | (bVar59 >= bVar5) * bVar59;
  bVar38 = (bVar26 < bVar38) * bVar38 | (bVar26 >= bVar38) * bVar26;
  bVar20 = (bVar28 < bVar20) * bVar20 | (bVar28 >= bVar20) * bVar28;
  bVar24 = (bVar42 < bVar24) * bVar24 | (bVar42 >= bVar24) * bVar42;
  bVar41 = (bVar30 < bVar41) * bVar41 | (bVar30 >= bVar41) * bVar30;
  bVar38 = (bVar24 < bVar38) * bVar38 | (bVar24 >= bVar38) * bVar24;
  bVar20 = (bVar41 < bVar20) * bVar20 | (bVar41 >= bVar20) * bVar41;
  bVar38 = (bVar20 < bVar38) * bVar38 | (bVar20 >= bVar38) * bVar20;
  uVar8 = (bVar43 - uVar10 & 0xffff) >> 4;
  uVar9 = (bVar38 - uVar6 & 0xffff) >> 4;
  uVar11 = (bVar32 - uVar7 & 0xffff) >> 4;
  uVar10 = (uVar8 & 0xff) + uVar10;
  if (0xfe < uVar10) {
    uVar10 = 0xff;
  }
  uVar6 = (uVar9 & 0xff) + uVar6;
  if (0xfe < uVar6) {
    uVar6 = 0xff;
  }
  uVar7 = (uVar11 & 0xff) + uVar7;
  if (0xfe < uVar7) {
    uVar7 = 0xff;
  }
  bVar20 = (byte)uVar8;
  uVar8 = (uint)(byte)(bVar43 - bVar20);
  if (bVar43 < bVar20) {
    uVar8 = 0;
  }
  bVar20 = (byte)uVar9;
  uVar9 = (uint)(byte)(bVar38 - bVar20);
  if (bVar38 < bVar20) {
    uVar9 = 0;
  }
  bVar38 = (byte)uVar11;
  uVar11 = (uint)(byte)(bVar32 - bVar38);
  if (bVar32 < bVar38) {
    uVar11 = 0;
  }
  (start->field_0).u = uVar7 | 0xff000000 | uVar6 << 8 | uVar10 << 0x10;
  (end->field_0).u = uVar11 | uVar9 << 8 | uVar8 << 0x10 | 0xff000000;
  return;
}

Assistant:

void ColorBlock::boundsRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);

	Color32 minColor(255, 255, 255);
	Color32 maxColor(0, 0, 0);

	for(uint i = 0; i < 16; i++)
	{
		if (m_color[i].r < minColor.r) { minColor.r = m_color[i].r; }
		if (m_color[i].g < minColor.g) { minColor.g = m_color[i].g; }
		if (m_color[i].b < minColor.b) { minColor.b = m_color[i].b; }
		if (m_color[i].r > maxColor.r) { maxColor.r = m_color[i].r; }
		if (m_color[i].g > maxColor.g) { maxColor.g = m_color[i].g; }
		if (m_color[i].b > maxColor.b) { maxColor.b = m_color[i].b; }
	}

	// Offset range by 1/16 of the extents
	Color32 inset;
	inset.r = (maxColor.r - minColor.r) >> 4;
	inset.g = (maxColor.g - minColor.g) >> 4;
	inset.b = (maxColor.b - minColor.b) >> 4;

	minColor.r = (minColor.r + inset.r <= 255) ? minColor.r + inset.r : 255;
	minColor.g = (minColor.g + inset.g <= 255) ? minColor.g + inset.g : 255;
	minColor.b = (minColor.b + inset.b <= 255) ? minColor.b + inset.b : 255;

	maxColor.r = (maxColor.r >= inset.r) ? maxColor.r - inset.r : 0;
	maxColor.g = (maxColor.g >= inset.g) ? maxColor.g - inset.g : 0;
	maxColor.b = (maxColor.b >= inset.b) ? maxColor.b - inset.b : 0;

	*start = minColor;
	*end = maxColor;
}